

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::UpdateTree
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer piVar1;
  pointer pcVar2;
  int BlockNum;
  long lVar3;
  uint uVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  string local_70;
  string local_50;
  
  piVar5 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar1 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->Index_FileName)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->Index_FileName)._M_string_length);
  BlockNum = Buffer::Find(&blocks,&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (BlockNum == -1) {
    pcVar2 = (this->Index_FileName)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->Index_FileName)._M_string_length);
    BlockNum = Buffer::Allocate(&blocks,&local_70,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = (long)BlockNum;
  blocks.buffer[lVar3].data[0] = this->Data_Type;
  *(int *)(blocks.buffer[lVar3].data + 1) = this->N;
  *(int *)(blocks.buffer[lVar3].data + 5) = (this->RootAddr).FileOff;
  *(int *)(blocks.buffer[lVar3].data + 9) = this->Current_Off;
  iVar7 = (int)((ulong)((long)piVar5 - (long)piVar1) >> 2);
  *(int *)(blocks.buffer[lVar3].data + 0xd) = iVar7;
  if (0 < iVar7) {
    piVar5 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = 999;
    if (iVar7 - 1U < 999) {
      uVar4 = iVar7 - 1U;
    }
    lVar6 = 0;
    do {
      *(int *)(lVar3 * 0x2028 + 0x15e3d5 + lVar6 * 4) = piVar5[-1];
      piVar5 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar5;
      lVar6 = lVar6 + 1;
    } while (uVar4 + 1 != (int)lVar6);
  }
  Buffer::Lock(&blocks,BlockNum);
  return;
}

Assistant:

void BpTree<K>::UpdateTree(void) {
	int i, s = this->FileOff_bin.size();
	int BlockNum = blocks.Find(this->Index_FileName, 0);
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, 0);
	}
	char* p = blocks.buffer[BlockNum].data;
	memcpy(p, &this->Data_Type, sizeof(char));
	p += sizeof(char);
	memcpy(p, reinterpret_cast<char*>(&this->N), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->RootAddr.FileOff), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->Current_Off), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&s), sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s && i < 1000; i++) {
		memcpy(p, reinterpret_cast<char*>(&this->FileOff_bin.back()), sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.pop_back();
	}
	blocks.Lock(BlockNum);
}